

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-256.c
# Opt level: O3

void pp_crypto_hash_sha2_256_process(PHashSHA2_256 *ctx,puint32 *data)

{
  puint32 *ppVar1;
  puint32 *ppVar2;
  long lVar3;
  uint uVar4;
  puint32 pVar5;
  puint32 pVar6;
  puint32 pVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  bool bVar11;
  int *piVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  uint local_174 [3];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f8 [50];
  
  local_140 = ctx->hash;
  local_168 = *(undefined8 *)ctx->hash;
  uStack_160 = *(undefined8 *)(ctx->hash + 2);
  local_158 = *(undefined8 *)(ctx->hash + 4);
  uVar10 = *(undefined8 *)(ctx->hash + 6);
  uStack_150 = uVar10;
  local_138 = *(undefined8 *)data;
  uStack_130 = *(undefined8 *)(data + 2);
  local_128 = *(undefined8 *)(data + 4);
  uStack_120 = *(undefined8 *)(data + 6);
  local_118 = *(undefined8 *)(data + 8);
  uStack_110 = *(undefined8 *)(data + 10);
  local_108 = *(undefined8 *)(data + 0xc);
  uStack_100 = *(undefined8 *)(data + 0xe);
  uStack_150._4_4_ = (uint)((ulong)uVar10 >> 0x20);
  local_158._4_4_ = (uint)((ulong)local_158 >> 0x20);
  uStack_150._0_4_ = (uint)uVar10;
  local_168._4_4_ = (uint)((ulong)local_168 >> 0x20);
  uStack_160._4_4_ = (uint)((ulong)uStack_160 >> 0x20);
  piVar12 = (int *)&local_138;
  lVar19 = 0;
  bVar20 = true;
  do {
    bVar11 = bVar20;
    iVar14 = (((uint)local_158 << 7 | (uint)local_158 >> 0x19) ^
             ((uint)local_158 << 0x15 | (uint)local_158 >> 0xb) ^
             ((uint)local_158 << 0x1a | (uint)local_158 >> 6)) + uStack_150._4_4_ +
             pp_crypto_hash_sha2_256_K[lVar19] + *piVar12 +
             ((local_158._4_4_ ^ (uint)uStack_150) & (uint)local_158 ^ (uint)uStack_150);
    uStack_160._4_4_ = uStack_160._4_4_ + iVar14;
    uStack_150._4_4_ =
         ((local_168._4_4_ | (uint)local_168) & (uint)uStack_160 | local_168._4_4_ & (uint)local_168
         ) + (((uint)local_168 << 10 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 << 0x13 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 << 0x1e | (uint)local_168 >> 2)) + iVar14;
    iVar14 = ((local_158._4_4_ ^ (uint)local_158) & uStack_160._4_4_ ^ local_158._4_4_) +
             (uint)uStack_150 + pp_crypto_hash_sha2_256_K[lVar19 + 1] +
             ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
             (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
             (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6)) +
             *(int *)((long)&local_138 + lVar19 * 4 + 4);
    uStack_160._0_4_ = (uint)uStack_160 + iVar14;
    uStack_150._0_4_ =
         ((uStack_150._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_150._4_4_ & (uint)local_168) +
         ((uStack_150._4_4_ * 0x400 | uStack_150._4_4_ >> 0x16) ^
         (uStack_150._4_4_ * 0x80000 | uStack_150._4_4_ >> 0xd) ^
         (uStack_150._4_4_ * 0x40000000 | uStack_150._4_4_ >> 2)) + iVar14;
    iVar14 = local_158._4_4_ + pp_crypto_hash_sha2_256_K[lVar19 + 2] +
             *(int *)((long)&uStack_130 + lVar19 * 4) +
             ((uStack_160._4_4_ ^ (uint)local_158) & (uint)uStack_160 ^ (uint)local_158) +
             (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
             ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
             ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar14;
    local_158._4_4_ =
         iVar14 + (((uint)uStack_150 | uStack_150._4_4_) & (uint)local_168 |
                  (uint)uStack_150 & uStack_150._4_4_) +
                  (((uint)uStack_150 * 0x400 | (uint)uStack_150 >> 0x16) ^
                  ((uint)uStack_150 * 0x80000 | (uint)uStack_150 >> 0xd) ^
                  ((uint)uStack_150 * 0x40000000 | (uint)uStack_150 >> 2));
    iVar14 = (uint)local_158 + pp_crypto_hash_sha2_256_K[lVar19 + 3] +
             *(int *)((long)&uStack_130 + lVar19 * 4 + 4) +
             (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
             ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
             (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
             (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar14;
    local_158._0_4_ =
         iVar14 + ((local_158._4_4_ | (uint)uStack_150) & uStack_150._4_4_ |
                  local_158._4_4_ & (uint)uStack_150) +
                  ((local_158._4_4_ * 0x400 | local_158._4_4_ >> 0x16) ^
                  (local_158._4_4_ * 0x80000 | local_158._4_4_ >> 0xd) ^
                  (local_158._4_4_ * 0x40000000 | local_158._4_4_ >> 2));
    iVar14 = uStack_160._4_4_ + pp_crypto_hash_sha2_256_K[lVar19 + 4] +
             *(int *)((long)&local_128 + lVar19 * 4) +
             ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160) +
             (((uint)local_168 * 0x80 | (uint)local_168 >> 0x19) ^
             ((uint)local_168 * 0x200000 | (uint)local_168 >> 0xb) ^
             ((uint)local_168 * 0x4000000 | (uint)local_168 >> 6));
    uStack_150._4_4_ = uStack_150._4_4_ + iVar14;
    uStack_160._4_4_ =
         (((uint)local_158 | local_158._4_4_) & (uint)uStack_150 | (uint)local_158 & local_158._4_4_
         ) + (((uint)local_158 * 0x400 | (uint)local_158 >> 0x16) ^
             ((uint)local_158 * 0x80000 | (uint)local_158 >> 0xd) ^
             ((uint)local_158 * 0x40000000 | (uint)local_158 >> 2)) + iVar14;
    iVar14 = (uint)uStack_160 + pp_crypto_hash_sha2_256_K[lVar19 + 5] +
             *(int *)((long)&local_128 + lVar19 * 4 + 4) +
             (((uint)local_168 ^ local_168._4_4_) & uStack_150._4_4_ ^ local_168._4_4_) +
             ((uStack_150._4_4_ * 0x80 | uStack_150._4_4_ >> 0x19) ^
             (uStack_150._4_4_ * 0x200000 | uStack_150._4_4_ >> 0xb) ^
             (uStack_150._4_4_ * 0x4000000 | uStack_150._4_4_ >> 6));
    uStack_150._0_4_ = (uint)uStack_150 + iVar14;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_158) & local_158._4_4_ |
         uStack_160._4_4_ & (uint)local_158) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar14;
    iVar14 = local_168._4_4_ + pp_crypto_hash_sha2_256_K[lVar19 + 6] +
             *(int *)((long)&uStack_120 + lVar19 * 4) +
             ((uStack_150._4_4_ ^ (uint)local_168) & (uint)uStack_150 ^ (uint)local_168) +
             (((uint)uStack_150 * 0x80 | (uint)uStack_150 >> 0x19) ^
             ((uint)uStack_150 * 0x200000 | (uint)uStack_150 >> 0xb) ^
             ((uint)uStack_150 * 0x4000000 | (uint)uStack_150 >> 6));
    local_158._4_4_ = local_158._4_4_ + iVar14;
    local_168._4_4_ =
         (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_158 |
         (uint)uStack_160 & uStack_160._4_4_) +
         (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
         ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
         ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2)) + iVar14;
    iVar14 = (uint)local_168 + pp_crypto_hash_sha2_256_K[lVar19 + 7] +
             *(int *)((long)&uStack_120 + lVar19 * 4 + 4) +
             (((uint)uStack_150 ^ uStack_150._4_4_) & local_158._4_4_ ^ uStack_150._4_4_) +
             ((local_158._4_4_ * 0x80 | local_158._4_4_ >> 0x19) ^
             (local_158._4_4_ * 0x200000 | local_158._4_4_ >> 0xb) ^
             (local_158._4_4_ * 0x4000000 | local_158._4_4_ >> 6));
    local_158._0_4_ = (uint)local_158 + iVar14;
    local_168._0_4_ =
         ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
         local_168._4_4_ & (uint)uStack_160) +
         ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
         (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
         (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2)) + iVar14;
    lVar19 = 8;
    piVar12 = (int *)&local_118;
    bVar20 = false;
  } while (bVar11);
  local_148 = 0x10;
  local_138._0_4_ = (uint)*(undefined8 *)data;
  do {
    uVar18 = *(uint *)((long)&local_140 + local_148 * 4);
    uVar4 = local_174[local_148];
    uVar13 = local_174[local_148 + 1];
    uVar15 = (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7)) +
             (uint)local_138 +
             (uVar18 >> 10 ^ (uVar18 << 0xd | uVar18 >> 0x13) ^ (uVar18 << 0xf | uVar18 >> 0x11)) +
             *(int *)((long)&local_158 + local_148 * 4 + 4);
    *(uint *)((long)&local_138 + local_148 * 4) = uVar15;
    iVar14 = (((uint)local_158 << 7 | (uint)local_158 >> 0x19) ^
             ((uint)local_158 << 0x15 | (uint)local_158 >> 0xb) ^
             ((uint)local_158 << 0x1a | (uint)local_158 >> 6)) + uStack_150._4_4_ +
             pp_crypto_hash_sha2_256_K[local_148] +
             ((local_158._4_4_ ^ (uint)uStack_150) & (uint)local_158 ^ (uint)uStack_150) + uVar15;
    uStack_160._4_4_ = uStack_160._4_4_ + iVar14;
    uStack_150._4_4_ =
         ((local_168._4_4_ | (uint)local_168) & (uint)uStack_160 | local_168._4_4_ & (uint)local_168
         ) + (((uint)local_168 << 10 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 << 0x13 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 << 0x1e | (uint)local_168 >> 2)) + iVar14;
    uVar18 = *(uint *)((long)&local_140 + local_148 * 4 + 4);
    uVar16 = uVar4 + *(int *)((long)&uStack_150 + local_148 * 4) +
             (uVar18 >> 10 ^ (uVar18 << 0xd | uVar18 >> 0x13) ^ (uVar18 << 0xf | uVar18 >> 0x11)) +
             (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7));
    *(uint *)((long)&local_138 + local_148 * 4 + 4) = uVar16;
    iVar14 = ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
             (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
             (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6)) + uVar16 +
             ((local_158._4_4_ ^ (uint)local_158) & uStack_160._4_4_ ^ local_158._4_4_) +
             (uint)uStack_150 + pp_crypto_hash_sha2_256_K[local_148 + 1];
    uStack_160._0_4_ = (uint)uStack_160 + iVar14;
    uStack_150._0_4_ =
         ((uStack_150._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_150._4_4_ & (uint)local_168) +
         ((uStack_150._4_4_ * 0x400 | uStack_150._4_4_ >> 0x16) ^
         (uStack_150._4_4_ * 0x80000 | uStack_150._4_4_ >> 0xd) ^
         (uStack_150._4_4_ * 0x40000000 | uStack_150._4_4_ >> 2)) + iVar14;
    uVar18 = local_174[local_148 + 2];
    uVar13 = (uVar15 >> 10 ^ (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11)
             ) + uVar13 + *(int *)((long)&uStack_150 + local_148 * 4 + 4) +
             (uVar18 >> 3 ^ (uVar18 << 0xe | uVar18 >> 0x12) ^ (uVar18 << 0x19 | uVar18 >> 7));
    *(uint *)((long)&uStack_130 + local_148 * 4) = uVar13;
    iVar14 = local_158._4_4_ + pp_crypto_hash_sha2_256_K[local_148 + 2] +
             ((uStack_160._4_4_ ^ (uint)local_158) & (uint)uStack_160 ^ (uint)local_158) + uVar13 +
             (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
             ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
             ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar14;
    local_158._4_4_ =
         iVar14 + (((uint)uStack_150 | uStack_150._4_4_) & (uint)local_168 |
                  (uint)uStack_150 & uStack_150._4_4_) +
                  (((uint)uStack_150 * 0x400 | (uint)uStack_150 >> 0x16) ^
                  ((uint)uStack_150 * 0x80000 | (uint)uStack_150 >> 0xd) ^
                  ((uint)uStack_150 * 0x40000000 | (uint)uStack_150 >> 2));
    uVar4 = *(uint *)((long)&local_168 + local_148 * 4);
    uVar17 = (uVar16 >> 10 ^ (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11)
             ) + uVar18 + *(int *)((long)&local_148 + local_148 * 4) +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    pVar5 = pp_crypto_hash_sha2_256_K[local_148 + 3];
    *(uint *)((long)&uStack_130 + local_148 * 4 + 4) = uVar17;
    iVar14 = (uint)local_158 + pVar5 + uVar17 +
             (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
             ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
             (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
             (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar14;
    local_158._0_4_ =
         iVar14 + ((local_158._4_4_ | (uint)uStack_150) & uStack_150._4_4_ |
                  local_158._4_4_ & (uint)uStack_150) +
                  ((local_158._4_4_ * 0x400 | local_158._4_4_ >> 0x16) ^
                  (local_158._4_4_ * 0x80000 | local_158._4_4_ >> 0xd) ^
                  (local_158._4_4_ * 0x40000000 | local_158._4_4_ >> 2));
    uVar18 = *(uint *)((long)&local_168 + local_148 * 4 + 4);
    uVar16 = (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             ) + uVar4 + *(int *)((long)&local_148 + local_148 * 4 + 4) +
             (uVar18 >> 3 ^ (uVar18 << 0xe | uVar18 >> 0x12) ^ (uVar18 << 0x19 | uVar18 >> 7));
    *(uint *)((long)&local_128 + local_148 * 4) = uVar16;
    iVar14 = uStack_160._4_4_ + pp_crypto_hash_sha2_256_K[local_148 + 4] + uVar16 +
             ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160) +
             (((uint)local_168 * 0x80 | (uint)local_168 >> 0x19) ^
             ((uint)local_168 * 0x200000 | (uint)local_168 >> 0xb) ^
             ((uint)local_168 * 0x4000000 | (uint)local_168 >> 6));
    uStack_150._4_4_ = uStack_150._4_4_ + iVar14;
    uStack_160._4_4_ =
         (((uint)local_158 | local_158._4_4_) & (uint)uStack_150 | (uint)local_158 & local_158._4_4_
         ) + (((uint)local_158 * 0x400 | (uint)local_158 >> 0x16) ^
             ((uint)local_158 * 0x80000 | (uint)local_158 >> 0xd) ^
             ((uint)local_158 * 0x40000000 | (uint)local_158 >> 2)) + iVar14;
    uVar4 = *(uint *)((long)&uStack_160 + local_148 * 4);
    uVar13 = *(uint *)((long)&uStack_160 + local_148 * 4 + 4);
    uVar18 = (uVar17 >> 10 ^ (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11)
             ) + uVar18 + *(int *)((long)&local_140 + local_148 * 4) +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    iVar14 = (uint)uStack_160 + pp_crypto_hash_sha2_256_K[local_148 + 5] + uVar18 +
             (((uint)local_168 ^ local_168._4_4_) & uStack_150._4_4_ ^ local_168._4_4_) +
             ((uStack_150._4_4_ * 0x80 | uStack_150._4_4_ >> 0x19) ^
             (uStack_150._4_4_ * 0x200000 | uStack_150._4_4_ >> 0xb) ^
             (uStack_150._4_4_ * 0x4000000 | uStack_150._4_4_ >> 6));
    uStack_150._0_4_ = (uint)uStack_150 + iVar14;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_158) & local_158._4_4_ |
         uStack_160._4_4_ & (uint)local_158) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar14;
    *(uint *)((long)&local_128 + local_148 * 4 + 4) = uVar18;
    iVar14 = (uVar16 >> 10 ^ (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11)
             ) + uVar4 + *(int *)((long)&local_140 + local_148 * 4 + 4) +
             (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7));
    pVar5 = pp_crypto_hash_sha2_256_K[local_148 + 6];
    *(int *)((long)&uStack_120 + local_148 * 4) = iVar14;
    iVar14 = local_168._4_4_ + pVar5 + iVar14 +
             ((uStack_150._4_4_ ^ (uint)local_168) & (uint)uStack_150 ^ (uint)local_168) +
             (((uint)uStack_150 * 0x80 | (uint)uStack_150 >> 0x19) ^
             ((uint)uStack_150 * 0x200000 | (uint)uStack_150 >> 0xb) ^
             ((uint)uStack_150 * 0x4000000 | (uint)uStack_150 >> 6));
    local_158._4_4_ = local_158._4_4_ + iVar14;
    local_168._4_4_ =
         (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_158 |
         (uint)uStack_160 & uStack_160._4_4_) +
         (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
         ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
         ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2)) + iVar14;
    local_138._0_4_ = *(uint *)((long)&local_158 + local_148 * 4);
    iVar14 = uVar15 + uVar13 +
             ((uint)local_138 >> 3 ^
             ((uint)local_138 << 0xe | (uint)local_138 >> 0x12) ^
             ((uint)local_138 << 0x19 | (uint)local_138 >> 7)) +
             (uVar18 >> 10 ^ (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11)
             );
    pVar5 = pp_crypto_hash_sha2_256_K[local_148 + 7];
    *(int *)((long)&uStack_120 + local_148 * 4 + 4) = iVar14;
    iVar14 = (uint)local_168 + pVar5 + iVar14 +
             (((uint)uStack_150 ^ uStack_150._4_4_) & local_158._4_4_ ^ uStack_150._4_4_) +
             ((local_158._4_4_ * 0x80 | local_158._4_4_ >> 0x19) ^
             (local_158._4_4_ * 0x200000 | local_158._4_4_ >> 0xb) ^
             (local_158._4_4_ * 0x4000000 | local_158._4_4_ >> 6));
    local_158._0_4_ = (uint)local_158 + iVar14;
    local_168._0_4_ =
         ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
         local_168._4_4_ & (uint)uStack_160) +
         ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
         (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
         (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2)) + iVar14;
    bVar20 = local_148 < 0x38;
    local_148 = local_148 + 8;
  } while (bVar20);
  lVar19 = 0;
  do {
    ppVar1 = local_140 + lVar19;
    pVar5 = ppVar1[1];
    pVar6 = ppVar1[2];
    pVar7 = ppVar1[3];
    lVar3 = lVar19 * 4;
    iVar14 = *(int *)((long)&local_168 + lVar3 + 4);
    iVar8 = *(int *)((long)&uStack_160 + lVar3);
    iVar9 = *(int *)((long)&uStack_160 + lVar3 + 4);
    ppVar2 = local_140 + lVar19;
    *ppVar2 = *ppVar1 + *(int *)((long)&local_168 + lVar3);
    ppVar2[1] = pVar5 + iVar14;
    ppVar2[2] = pVar6 + iVar8;
    ppVar2[3] = pVar7 + iVar9;
    lVar19 = lVar19 + 4;
  } while (lVar19 != 8);
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_256_process (PHashSHA2_256	*ctx,
				 const puint32	data[16])
{
	puint32	tmp_sum1;
	puint32	tmp_sum2;
	puint32 W[64];
	puint32	A[8];
	puint	i;

	for (i = 0; i < 8; i++)
		A[i] = ctx->hash[i];

	memcpy (W, data, 64);

	for (i = 0; i < 16; i += 8) {
		P_SHA2_256_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i + 0], pp_crypto_hash_sha2_256_K[i + 0])
		P_SHA2_256_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i + 1], pp_crypto_hash_sha2_256_K[i + 1])
		P_SHA2_256_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i + 2], pp_crypto_hash_sha2_256_K[i + 2])
		P_SHA2_256_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i + 3], pp_crypto_hash_sha2_256_K[i + 3])
		P_SHA2_256_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i + 4], pp_crypto_hash_sha2_256_K[i + 4])
		P_SHA2_256_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i + 5], pp_crypto_hash_sha2_256_K[i + 5])
		P_SHA2_256_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i + 6], pp_crypto_hash_sha2_256_K[i + 6])
		P_SHA2_256_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i + 7], pp_crypto_hash_sha2_256_K[i + 7])
	}

	for (i = 16; i < 64; i += 8) {
		P_SHA2_256_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], P_SHA2_256_R (i + 0), pp_crypto_hash_sha2_256_K[i + 0])
		P_SHA2_256_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], P_SHA2_256_R (i + 1), pp_crypto_hash_sha2_256_K[i + 1])
		P_SHA2_256_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], P_SHA2_256_R (i + 2), pp_crypto_hash_sha2_256_K[i + 2])
		P_SHA2_256_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], P_SHA2_256_R (i + 3), pp_crypto_hash_sha2_256_K[i + 3])
		P_SHA2_256_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], P_SHA2_256_R (i + 4), pp_crypto_hash_sha2_256_K[i + 4])
		P_SHA2_256_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], P_SHA2_256_R (i + 5), pp_crypto_hash_sha2_256_K[i + 5])
		P_SHA2_256_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], P_SHA2_256_R (i + 6), pp_crypto_hash_sha2_256_K[i + 6])
		P_SHA2_256_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], P_SHA2_256_R (i + 7), pp_crypto_hash_sha2_256_K[i + 7])
	}

	for (i = 0; i < 8; i++)
		ctx->hash[i] += A[i];
}